

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::copyTexImage2D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int x,int y,
          int width,int height,int border)

{
  uint uVar1;
  pointer pTVar2;
  undefined8 uVar3;
  ChannelOrder CVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Texture2D *pTVar11;
  PixelBufferAccess dst;
  MultisampleConstPixelBufferAccess src;
  TextureFormat local_a0;
  TextureCube *local_98;
  MultisamplePixelBufferAccess local_90;
  MultisampleConstPixelBufferAccess local_68;
  
  iVar10 = this->m_activeTexture;
  pTVar2 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a0.order = CHANNELORDER_LAST;
  local_a0.type = CHANNELTYPE_LAST;
  getReadColorbuffer(&local_90,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_68,&local_90);
  if (border != 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if ((width | level | height) < 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if (((local_68.m_access.m_size.m_data[0] == 0) || (local_68.m_access.m_size.m_data[1] == 0)) ||
     (local_68.m_access.m_size.m_data[2] == 0)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x502;
    return;
  }
  local_a0 = mapInternalFormat(internalFormat);
  CVar4 = local_a0.order;
  if (local_a0.type == CHANNELTYPE_LAST || CVar4 == CHANNELORDER_LAST) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (target == 0xde1) {
    uVar1 = (this->m_limits).maxTexture2DSize;
    if (width <= (int)uVar1 && height <= (int)uVar1) {
      if (uVar1 == 0) {
        uVar7 = 0x20;
      }
      else {
        uVar7 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar7 = uVar7 ^ 0x1f;
      }
      if (level <= (int)(0x1f - uVar7)) {
        pTVar11 = &pTVar2[iVar10].default2DTex;
        if (pTVar2[iVar10].tex2DBinding != (Texture2D *)0x0) {
          pTVar11 = pTVar2[iVar10].tex2DBinding;
        }
        if ((pTVar11->super_Texture).m_immutable == true) {
          if (((0xd < (uint)level) ||
              (*(long *)((long)((pTVar11->m_levels).m_data + (uint)level) + 8) == 0)) ||
             ((uVar3 = *(undefined8 *)((pTVar11->m_levels).m_access + (uint)level),
              CVar4 != (ChannelOrder)uVar3 ||
              (((local_a0.type != (ChannelType)((ulong)uVar3 >> 0x20) ||
                (*(int *)((long)((pTVar11->m_levels).m_access + (uint)level) + 8) != width)) ||
               (*(int *)((long)((pTVar11->m_levels).m_access + (uint)level) + 0xc) != height)))))) {
LAB_004e3411:
            if (this->m_lastError != 0) {
              return;
            }
            this->m_lastError = 0x502;
            return;
          }
        }
        else {
          rc::TextureLevelArray::allocLevel(&pTVar11->m_levels,level,&local_a0,width,height,1);
        }
        local_90.m_access.super_ConstPixelBufferAccess.m_format =
             *(TextureFormat *)((pTVar11->m_levels).m_access + level);
        lVar5 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar5] =
               *(int *)((long)((pTVar11->m_levels).m_access + level) + 8U + lVar5 * 4);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        lVar5 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_pitch.m_data[lVar5] =
               *(int *)((long)((pTVar11->m_levels).m_access + level) + 0x14U + lVar5 * 4);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        local_90.m_access.super_ConstPixelBufferAccess.m_data =
             *(void **)((long)((pTVar11->m_levels).m_access + level) + 0x20);
        if (height < 1) {
          return;
        }
        iVar10 = 0;
        do {
          if (0 < width) {
            iVar9 = 0;
            do {
              iVar8 = x + iVar9;
              if (((-1 < iVar8) && (iVar8 < local_68.m_access.m_size.m_data[1])) &&
                 ((-1 < iVar10 + y && (iVar10 + y < local_68.m_access.m_size.m_data[2])))) {
                rr::resolveMultisamplePixel
                          ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,
                           (int)&local_68,iVar8);
                tcu::PixelBufferAccess::setPixel
                          (&local_90.m_access,(Vec4 *)&stack0xffffffffffffffc0,iVar9,iVar10,0);
              }
              iVar9 = iVar9 + 1;
            } while (width != iVar9);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != height);
        return;
      }
    }
  }
  else {
    if (5 < target - 0x8515) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    if ((width == height) && (uVar1 = (this->m_limits).maxTextureCubeSize, width <= (int)uVar1)) {
      if (uVar1 == 0) {
        uVar7 = 0x20;
      }
      else {
        uVar7 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar7 = uVar7 ^ 0x1f;
      }
      if (level <= (int)(0x1f - uVar7)) {
        local_98 = &pTVar2[iVar10].defaultCubeTex;
        if (pTVar2[iVar10].texCubeBinding != (TextureCube *)0x0) {
          local_98 = pTVar2[iVar10].texCubeBinding;
        }
        lVar5 = 6;
        if ((ushort)(target + 0x7aeb) < 6) {
          lVar5 = *(long *)(&DAT_00688698 + (ulong)(target + 0x7aeb & 0xffff) * 8);
        }
        if ((local_98->super_Texture).m_immutable == true) {
          if (((0xd < (uint)level) ||
              (*(long *)((long)(local_98->m_levels[lVar5].m_data + (uint)level) + 8) == 0)) ||
             ((uVar3 = local_98->m_levels[lVar5].m_access[(uint)level].super_ConstPixelBufferAccess.
                       m_format, CVar4 != (ChannelOrder)uVar3 ||
              (((local_a0.type != (ChannelType)((ulong)uVar3 >> 0x20) ||
                (*(int *)((long)(local_98->m_levels[lVar5].m_access + (uint)level) + 8) != width))
               || (*(int *)((long)(local_98->m_levels[lVar5].m_access + (uint)level) + 0xc) !=
                   height)))))) goto LAB_004e3411;
        }
        else {
          rc::TextureLevelArray::allocLevel
                    (local_98->m_levels + lVar5,level,&local_a0,width,height,1);
        }
        local_90.m_access.super_ConstPixelBufferAccess.m_format =
             *(TextureFormat *)(local_98->m_levels[lVar5].m_access + level);
        lVar6 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar6] =
               *(int *)((long)(local_98->m_levels[lVar5].m_access + level) + 8U + lVar6 * 4);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        lVar6 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_pitch.m_data[lVar6] =
               *(int *)((long)(local_98->m_levels[lVar5].m_access + level) + 0x14U + lVar6 * 4);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_90.m_access.super_ConstPixelBufferAccess.m_data =
             *(void **)((long)(local_98->m_levels[lVar5].m_access + level) + 0x20);
        if (height < 1) {
          return;
        }
        iVar10 = 0;
        do {
          if (0 < width) {
            iVar9 = 0;
            do {
              iVar8 = x + iVar9;
              if (((-1 < iVar8) && (iVar8 < local_68.m_access.m_size.m_data[1])) &&
                 ((-1 < iVar10 + y && (iVar10 + y < local_68.m_access.m_size.m_data[2])))) {
                rr::resolveMultisamplePixel
                          ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,
                           (int)&local_68,iVar8);
                tcu::PixelBufferAccess::setPixel
                          (&local_90.m_access,(Vec4 *)&stack0xffffffffffffffc0,iVar9,iVar10,0);
              }
              iVar9 = iVar9 + 1;
            } while (width != iVar9);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != height);
        return;
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::copyTexImage2D (deUint32 target, int level, deUint32 internalFormat, int x, int y, int width, int height, int border)
{
	TextureUnit&							unit		= m_textureUnits[m_activeTexture];
	TextureFormat							storageFmt;
	rr::MultisampleConstPixelBufferAccess	src			= getReadColorbuffer();

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src), GL_INVALID_OPERATION, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_2D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height > m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2D* texture = unit.tex2DBinding ? unit.tex2DBinding : &unit.default2DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getLevel(level);
		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo, yo);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		// Validate size and level.
		RC_IF_ERROR(width != height || width > m_limits.maxTextureCubeSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTextureCubeSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCube*	texture	= unit.texCubeBinding ? unit.texCubeBinding : &unit.defaultCubeTex;
		tcu::CubeFace	face	= mapGLCubeFace(target);

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasFace(level, face), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getFace(level, face));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocFace(level, face, storageFmt, width, height);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getFace(level, face);
		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo, yo);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}